

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O3

string * __thiscall
tinyusdz::ascii::AsciiParser::GetError_abi_cxx11_(string *__return_storage_ptr__,AsciiParser *this)

{
  pointer pcVar1;
  ostream *poVar2;
  _Elt_pointer pEVar3;
  ErrorDiagnostic diag;
  stringstream ss;
  long *local_1e0;
  long local_1d8;
  long local_1d0 [2];
  Cursor local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  if ((this->err_stack).c.
      super__Deque_base<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,_std::allocator<tinyusdz::ascii::AsciiParser::ErrorDiagnostic>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      (this->err_stack).c.
      super__Deque_base<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,_std::allocator<tinyusdz::ascii::AsciiParser::ErrorDiagnostic>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    ::std::__cxx11::stringstream::stringstream(local_1b8);
    pEVar3 = (this->err_stack).c.
             super__Deque_base<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,_std::allocator<tinyusdz::ascii::AsciiParser::ErrorDiagnostic>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pEVar3 != (this->err_stack).c.
                  super__Deque_base<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,_std::allocator<tinyusdz::ascii::AsciiParser::ErrorDiagnostic>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      do {
        if (pEVar3 == (this->err_stack).c.
                      super__Deque_base<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,_std::allocator<tinyusdz::ascii::AsciiParser::ErrorDiagnostic>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
          pEVar3 = (this->err_stack).c.
                   super__Deque_base<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,_std::allocator<tinyusdz::ascii::AsciiParser::ErrorDiagnostic>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0xc;
        }
        pcVar1 = pEVar3[-1].err._M_dataplus._M_p;
        local_1e0 = local_1d0;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1e0,pcVar1,pcVar1 + pEVar3[-1].err._M_string_length);
        local_1c0 = pEVar3[-1].cursor;
        ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"err_stack[",10);
        poVar2 = ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"] USDA source near line ",0x18)
        ;
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,local_1c0.row + 1);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,", col ",6);
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,local_1c0.col + 1);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
        ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_1e0,local_1d8);
        ::std::
        deque<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,_std::allocator<tinyusdz::ascii::AsciiParser::ErrorDiagnostic>_>
        ::pop_back(&(this->err_stack).c);
        if (local_1e0 != local_1d0) {
          operator_delete(local_1e0,local_1d0[0] + 1);
        }
        pEVar3 = (this->err_stack).c.
                 super__Deque_base<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,_std::allocator<tinyusdz::ascii::AsciiParser::ErrorDiagnostic>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      } while (pEVar3 != (this->err_stack).c.
                         super__Deque_base<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,_std::allocator<tinyusdz::ascii::AsciiParser::ErrorDiagnostic>_>
                         ._M_impl.super__Deque_impl_data._M_start._M_cur);
    }
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::stringstream::~stringstream(local_1b8);
    ::std::ios_base::~ios_base(local_138);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string AsciiParser::GetError() {
  if (err_stack.empty()) {
    return std::string();
  }

  std::stringstream ss;
  while (!err_stack.empty()) {
    ErrorDiagnostic diag = err_stack.top();

    ss << "err_stack[" << (err_stack.size() - 1) << "] USDA source near line "
       << (diag.cursor.row + 1) << ", col " << (diag.cursor.col + 1) << ": ";
    ss << diag.err;  // assume message contains newline.

    err_stack.pop();
  }

  return ss.str();
}